

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec_tracker.cpp
# Opt level: O2

void __thiscall despot::ExecTracker::Print(ExecTracker *this,ostream *out)

{
  ostream *poVar1;
  _Base_ptr p_Var2;
  _Self __tmp;
  
  for (p_Var2 = (this->creation_loc_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->creation_loc_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    poVar1 = std::operator<<(out,"(");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 1));
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 2));
    poVar1 = std::operator<<(poVar1,")");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return;
}

Assistant:

void ExecTracker::Print(ostream& out) const {
	for (map<string, string>::const_iterator it = creation_loc_.begin();
		it != creation_loc_.end(); it++) {
		out << "(" << it->first << ", " << it->second << ")" << endl;
	}
}